

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::TypeExpr::toString_abi_cxx11_(string *__return_storage_ptr__,TypeExpr *this)

{
  Token *pTVar1;
  bool bVar2;
  type caps;
  pointer pEVar3;
  Lexer *pLVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  undefined1 local_19;
  TypeExpr *local_18;
  TypeExpr *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (TypeExpr *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->super_Capable);
  if (bVar2) {
    caps = std::unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>::
           operator*(&(this->super_Capable).caps);
    _capsToString_abi_cxx11_(&local_40,caps);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                     (&this->expr);
  (*pEVar3->_vptr_Expr[2])();
  std::operator+(&local_a0,"type ",&local_c0);
  std::operator+(&local_80,&local_a0,' ');
  pTVar1 = this->tokId;
  pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                     (&this->expr);
  pLVar4 = Expr::getLexer(pEVar3);
  (*pTVar1->_vptr_Token[2])(&local_e0,pTVar1,pLVar4);
  std::operator+(&local_60,&local_80,&local_e0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

std::string TypeExpr::toString() const noexcept {
  std::string result;
  if (caps)
    result += _capsToString(*caps);
  result += "type " + expr->toString() + ' ' + tokId->toString(expr->getLexer());
  return result;
}